

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toc.c
# Opt level: O2

int cueify_device_read_toc(cueify_device *d,cueify_toc *t)

{
  int iVar1;
  cueify_toc_private *toc;
  cueify_device_private *dev;
  
  if (t == (cueify_toc *)0x0 || d == (cueify_device *)0x0) {
    return 3;
  }
  memset(t,0,0x324);
  iVar1 = cueify_device_read_toc_unportable((cueify_device_private *)d,(cueify_toc_private *)t);
  return iVar1;
}

Assistant:

int cueify_device_read_toc(cueify_device *d, cueify_toc *t) {
    cueify_device_private *dev = (cueify_device_private *)d;
    cueify_toc_private *toc = (cueify_toc_private *)t;

    if (d == NULL || t == NULL) {
	return CUEIFY_ERR_BADARG;
    }

    memset(toc, 0, sizeof(cueify_toc_private));

    return cueify_device_read_toc_unportable(dev, toc);
}